

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

char * get_imm_str_s(uint size)

{
  uint uVar1;
  char *pcVar2;
  uint size_local;
  
  if (size == 0) {
    uVar1 = dasm_read_imm_8(2);
    pcVar2 = make_signed_hex_str_8(uVar1);
    sprintf(get_imm_str_s::str,"#%s",pcVar2);
  }
  else if (size == 1) {
    uVar1 = dasm_read_imm_16(2);
    pcVar2 = make_signed_hex_str_16(uVar1);
    sprintf(get_imm_str_s::str,"#%s",pcVar2);
  }
  else {
    uVar1 = dasm_read_imm_32(4);
    pcVar2 = make_signed_hex_str_32(uVar1);
    sprintf(get_imm_str_s::str,"#%s",pcVar2);
  }
  return get_imm_str_s::str;
}

Assistant:

static char* get_imm_str_s(uint size)
{
	static char str[15];
	if(size == 0)
		sprintf(str, "#%s", make_signed_hex_str_8(read_imm_8()));
	else if(size == 1)
		sprintf(str, "#%s", make_signed_hex_str_16(read_imm_16()));
	else
		sprintf(str, "#%s", make_signed_hex_str_32(read_imm_32()));
	return str;
}